

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbg.c
# Opt level: O2

void dbgaddhist(dbgcxdef *ctx,char *buf,int l)

{
  char *__dest;
  uint uVar1;
  int iVar2;
  long lVar3;
  
  uVar1 = ctx->dbgcxhstf;
  if (ctx->dbgcxhstl <= l + uVar1 + 1) {
    __dest = ctx->dbgcxhstp;
    for (lVar3 = 0; iVar2 = (int)lVar3, iVar2 < l || __dest[lVar3] != '\0'; lVar3 = lVar3 + 1) {
    }
    memmove(__dest,__dest + lVar3,(ulong)(uVar1 - iVar2));
    uVar1 = ctx->dbgcxhstf - iVar2;
    ctx->dbgcxhstf = uVar1;
  }
  memcpy(ctx->dbgcxhstp + uVar1,buf,(long)l);
  ctx->dbgcxhstf = ctx->dbgcxhstf + l;
  return;
}

Assistant:

void dbgaddhist(dbgcxdef *ctx, char *buf, int l)
{
    char *p;
    int   dell;

    if (ctx->dbgcxhstf + l + 1 >= ctx->dbgcxhstl)
    {
        /* delete first lines until we have enough space */
        for (dell = 0, p = ctx->dbgcxhstp ; *p || dell < l ; ++p, ++dell) ;
        if (*p) ++p;
        memmove(ctx->dbgcxhstp, ctx->dbgcxhstp + dell,
                (size_t)(ctx->dbgcxhstf - dell));
        ctx->dbgcxhstf -= dell;
    }
    memcpy(ctx->dbgcxhstp + ctx->dbgcxhstf, buf, (size_t)l);
    ctx->dbgcxhstf += l;
}